

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmainwindow.cpp
# Opt level: O3

void QMainWindow::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QSize *iconSize;
  TabShape *pTVar1;
  code *pcVar2;
  long lVar3;
  byte bVar4;
  bool bVar5;
  TabShape TVar6;
  int iVar7;
  QFlagsStorage<QMainWindow::DockOption> opts;
  QMainWindowLayout *this;
  long in_FS_OFFSET;
  undefined8 local_30;
  void *local_28;
  undefined8 *local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_20 = (undefined8 *)_a[1];
      iVar7 = 0;
      break;
    case 1:
      local_20 = &local_30;
      local_30 = CONCAT44(local_30._4_4_,*_a[1]);
      iVar7 = 1;
      break;
    case 2:
      local_30 = *_a[1];
      local_20 = &local_30;
      iVar7 = 2;
      break;
    case 3:
      bVar4 = *_a[1];
LAB_0042ad0a:
      this = *(QMainWindowLayout **)(*(long *)(_o + 8) + 0x260);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        opts.i = *(uint *)(this + 0x700) & 0xfffffffe | (uint)bVar4;
LAB_0042ae06:
        QMainWindowLayout::setDockOptions(this,(DockOptions)opts.i);
        return;
      }
      goto LAB_0042aecf;
    case 4:
      bVar4 = *_a[1];
LAB_0042ada1:
      this = *(QMainWindowLayout **)(*(long *)(_o + 8) + 0x260);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_10) goto LAB_0042aecf;
      opts.i = (*(uint *)(this + 0x700) & 0xfffffffd) + (uint)bVar4 * 2;
      goto LAB_0042ae06;
    default:
      goto switchD_0042ab4a_caseD_3;
    }
    local_28 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar7,&local_28);
    break;
  case ReadProperty:
    if (7 < (uint)_id) break;
    pTVar1 = (TabShape *)*_a;
    switch(_id) {
    case 0:
      *(undefined8 *)pTVar1 = *(undefined8 *)(*(long *)(_o + 8) + 0x268);
      break;
    case 1:
      TVar6 = *(TabShape *)(*(long *)(_o + 8) + 0x274);
      goto LAB_0042aeb7;
    case 2:
      bVar4 = *(byte *)(*(long *)(*(long *)(_o + 8) + 0x260) + 0x700);
      goto LAB_0042ae96;
    case 3:
      bVar5 = QMainWindowLayout::documentMode(*(QMainWindowLayout **)(*(long *)(_o + 8) + 0x260));
      goto LAB_0042ae98;
    case 4:
      TVar6 = QMainWindowLayout::tabShape(*(QMainWindowLayout **)(*(long *)(_o + 8) + 0x260));
      goto LAB_0042aeb7;
    case 5:
      bVar4 = *(byte *)(*(long *)(*(long *)(_o + 8) + 0x260) + 0x700) >> 1;
LAB_0042ae96:
      bVar5 = (bool)(bVar4 & 1);
LAB_0042ae98:
      *(bool *)pTVar1 = bVar5;
      break;
    case 6:
      TVar6 = *(TabShape *)(*(long *)(*(long *)(_o + 8) + 0x260) + 0x700);
LAB_0042aeb7:
      *pTVar1 = TVar6;
      break;
    case 7:
      *(undefined1 *)pTVar1 = Rounded;
    }
    break;
  case WriteProperty:
    if ((uint)_id < 7) {
      iconSize = (QSize *)*_a;
      switch(_id) {
      case 0:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
          setIconSize((QMainWindow *)_o,iconSize);
          return;
        }
        break;
      case 1:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
          setToolButtonStyle((QMainWindow *)_o,(iconSize->wd).m_i);
          return;
        }
        break;
      case 2:
        bVar4 = (byte)(iconSize->wd).m_i;
        goto LAB_0042ad0a;
      case 3:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
          QMainWindowLayout::setDocumentMode
                    (*(QMainWindowLayout **)(*(long *)(_o + 8) + 0x260),SUB41((iconSize->wd).m_i,0))
          ;
          return;
        }
        break;
      case 4:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
          QMainWindowLayout::setTabShape
                    (*(QMainWindowLayout **)(*(long *)(_o + 8) + 0x260),(iconSize->wd).m_i);
          return;
        }
        break;
      case 5:
        bVar4 = (byte)(iconSize->wd).m_i;
        goto LAB_0042ada1;
      case 6:
        opts.i = (iconSize->wd).m_i;
        this = *(QMainWindowLayout **)(*(long *)(_o + 8) + 0x260);
        if (*(long *)(in_FS_OFFSET + 0x28) != local_10) break;
        goto LAB_0042ae06;
      }
      goto LAB_0042aecf;
    }
    break;
  case IndexOfMethod:
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == iconSizeChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar2 == toolButtonStyleChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar2 == tabifiedDockWidgetActivated && lVar3 == 0) {
      *(undefined4 *)*_a = 2;
    }
  }
switchD_0042ab4a_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
LAB_0042aecf:
  __stack_chk_fail();
}

Assistant:

void QMainWindow::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QMainWindow *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->iconSizeChanged((*reinterpret_cast< std::add_pointer_t<QSize>>(_a[1]))); break;
        case 1: _t->toolButtonStyleChanged((*reinterpret_cast< std::add_pointer_t<Qt::ToolButtonStyle>>(_a[1]))); break;
        case 2: _t->tabifiedDockWidgetActivated((*reinterpret_cast< std::add_pointer_t<QDockWidget*>>(_a[1]))); break;
        case 3: _t->setAnimated((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 4: _t->setDockNestingEnabled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 5: _t->setUnifiedTitleAndToolBarOnMac((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QMainWindow::*)(const QSize & )>(_a, &QMainWindow::iconSizeChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QMainWindow::*)(Qt::ToolButtonStyle )>(_a, &QMainWindow::toolButtonStyleChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QMainWindow::*)(QDockWidget * )>(_a, &QMainWindow::tabifiedDockWidgetActivated, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QSize*>(_v) = _t->iconSize(); break;
        case 1: *reinterpret_cast<Qt::ToolButtonStyle*>(_v) = _t->toolButtonStyle(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isAnimated(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->documentMode(); break;
        case 4: *reinterpret_cast<QTabWidget::TabShape*>(_v) = _t->tabShape(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->isDockNestingEnabled(); break;
        case 6: QtMocHelpers::assignFlags<DockOptions>(_v, _t->dockOptions()); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->unifiedTitleAndToolBarOnMac(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setIconSize(*reinterpret_cast<QSize*>(_v)); break;
        case 1: _t->setToolButtonStyle(*reinterpret_cast<Qt::ToolButtonStyle*>(_v)); break;
        case 2: _t->setAnimated(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setDocumentMode(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setTabShape(*reinterpret_cast<QTabWidget::TabShape*>(_v)); break;
        case 5: _t->setDockNestingEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setDockOptions(*reinterpret_cast<DockOptions*>(_v)); break;
        case 7: _t->setUnifiedTitleAndToolBarOnMac(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}